

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalNinjaGenerator::AddMacOSXContentRule(cmGlobalNinjaGenerator *this)

{
  long *plVar1;
  long *plVar2;
  cmNinjaRule rule;
  char *local_1a0;
  size_type local_198;
  char local_190 [8];
  undefined8 uStack_188;
  string local_180;
  long *local_160;
  long local_158;
  long local_150;
  long lStack_148;
  undefined1 local_140 [32];
  _Alloc_hider local_120;
  size_type local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  _Alloc_hider local_100;
  char *local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  _Alloc_hider local_e0;
  char *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Alloc_hider local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  _Alloc_hider local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  bool local_20;
  
  local_1a0 = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"COPY_OSX_CONTENT","");
  local_140._0_8_ = local_140 + 0x10;
  if (local_1a0 == local_190) {
    local_140._24_8_ = uStack_188;
  }
  else {
    local_140._0_8_ = local_1a0;
  }
  local_120._M_p = (pointer)&local_110;
  local_140._8_8_ = local_198;
  local_198 = 0;
  local_190[0] = '\0';
  local_118 = 0;
  local_110._M_local_buf[0] = '\0';
  local_100._M_p = (pointer)&local_f0;
  local_f8 = (char *)0x0;
  local_f0._M_local_buf[0] = '\0';
  local_e0._M_p = (pointer)&local_d0;
  local_d8 = (char *)0x0;
  local_d0._M_local_buf[0] = '\0';
  local_c0._M_p = (pointer)&local_b0;
  local_b8 = 0;
  local_b0._M_local_buf[0] = '\0';
  local_a0._M_p = (pointer)&local_90;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80._M_p = (pointer)&local_70;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_60._M_p = (pointer)&local_50;
  local_58 = 0;
  local_50._M_local_buf[0] = '\0';
  local_40._M_p = (pointer)&local_30;
  local_38 = 0;
  local_30._M_local_buf[0] = '\0';
  local_20 = false;
  local_1a0 = local_190;
  CMakeCmd_abi_cxx11_(&local_180,this);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_180);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_150 = *plVar2;
    lStack_148 = plVar1[3];
    local_160 = &local_150;
  }
  else {
    local_150 = *plVar2;
    local_160 = (long *)*plVar1;
  }
  local_158 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_120,(string *)&local_160);
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_replace((ulong)&local_100,0,local_f8,0x52bfb7);
  std::__cxx11::string::_M_replace((ulong)&local_e0,0,local_d8,0x52bfd1);
  AddRule(this,(cmNinjaRule *)local_140);
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_140);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AddMacOSXContentRule()
{
  cmNinjaRule rule("COPY_OSX_CONTENT");
  rule.Command = CMakeCmd() + " -E copy $in $out";
  rule.Description = "Copying OS X Content $out";
  rule.Comment = "Rule for copying OS X bundle content file.";
  this->AddRule(rule);
}